

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O0

void __thiscall sznet::net::EventLoop::EventLoop(EventLoop *this)

{
  sz_pid_t sVar1;
  sz_event sVar2;
  LogLevel LVar3;
  Poller *__p;
  TimerQueue *this_00;
  Channel *this_01;
  LogStream *pLVar4;
  self *psVar5;
  pointer pCVar6;
  long *in_FS_OFFSET;
  SourceFile file;
  SourceFile file_00;
  EventLoop *local_2030;
  code *local_2028;
  undefined8 local_2020;
  type local_2018;
  ReadEventCallback local_2000;
  undefined1 local_1fe0 [12];
  Logger local_1fd0;
  undefined1 local_1000 [12];
  Logger local_ff0;
  EventLoop *local_10;
  EventLoop *this_local;
  
  this->_vptr_EventLoop = (_func_int **)&PTR__EventLoop_001a3658;
  this->m_looping = false;
  local_10 = this;
  std::atomic<bool>::atomic(&this->m_quit,false);
  this->m_eventHandling = false;
  this->m_callingPendingFunctors = false;
  this->m_iteration = 0;
  sVar1 = CurrentThread::tid();
  this->m_threadId = sVar1;
  Timestamp::Timestamp(&this->m_pollTime);
  __p = Poller::newDefaultPoller(this);
  std::unique_ptr<sznet::net::Poller,std::default_delete<sznet::net::Poller>>::
  unique_ptr<std::default_delete<sznet::net::Poller>,void>
            ((unique_ptr<sznet::net::Poller,std::default_delete<sznet::net::Poller>> *)
             &this->m_poller,__p);
  this_00 = (TimerQueue *)operator_new(0x50);
  TimerQueue::TimerQueue(this_00,this);
  std::unique_ptr<sznet::TimerQueue,std::default_delete<sznet::TimerQueue>>::
  unique_ptr<std::default_delete<sznet::TimerQueue>,void>
            ((unique_ptr<sznet::TimerQueue,std::default_delete<sznet::TimerQueue>> *)
             &this->m_timerQueue,this_00);
  sVar2 = sockets::sz_create_eventfd();
  this->m_wakeupFd = sVar2;
  this_01 = (Channel *)operator_new(0xb8);
  Channel::Channel(this_01,this,this->m_wakeupFd);
  std::unique_ptr<sznet::net::Channel,std::default_delete<sznet::net::Channel>>::
  unique_ptr<std::default_delete<sznet::net::Channel>,void>
            ((unique_ptr<sznet::net::Channel,std::default_delete<sznet::net::Channel>> *)
             &this->m_wakeupChannel,this_01);
  std::vector<sznet::net::Channel_*,_std::allocator<sznet::net::Channel_*>_>::vector
            (&this->m_activeChannels);
  this->m_currentActiveChannel = (Channel *)0x0;
  MutexLock::MutexLock(&this->m_mutex);
  std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::vector
            (&this->m_pendingFunctors);
  LVar3 = Logger::logLevel();
  if ((int)LVar3 < 2) {
    Logger::SourceFile::SourceFile<100>
              ((SourceFile *)local_1000,
               (char (*) [100])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/EventLoop.cpp"
              );
    file._12_4_ = 0;
    file.m_data = (char *)local_1000._0_8_;
    file.m_size = local_1000._8_4_;
    Logger::Logger(&local_ff0,file,0x38,DEBUG,"EventLoop");
    pLVar4 = Logger::stream(&local_ff0);
    psVar5 = LogStream::operator<<(pLVar4,"EventLoop created ");
    pLVar4 = LogStream::operator<<(psVar5,this);
    psVar5 = LogStream::operator<<(pLVar4," in thread ");
    LogStream::operator<<(psVar5,this->m_threadId);
    Logger::~Logger(&local_ff0);
  }
  if (*(long *)(*in_FS_OFFSET + -0x238) == 0) {
    *(EventLoop **)(*in_FS_OFFSET + -0x238) = this;
  }
  else {
    Logger::SourceFile::SourceFile<100>
              ((SourceFile *)local_1fe0,
               (char (*) [100])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/EventLoop.cpp"
              );
    file_00._12_4_ = 0;
    file_00.m_data = (char *)local_1fe0._0_8_;
    file_00.m_size = local_1fe0._8_4_;
    Logger::Logger(&local_1fd0,file_00,0x3b,FATAL);
    pLVar4 = Logger::stream(&local_1fd0);
    psVar5 = LogStream::operator<<(pLVar4,"Another EventLoop ");
    pLVar4 = LogStream::operator<<(psVar5,(void *)in_FS_OFFSET[-0x47]);
    psVar5 = LogStream::operator<<(pLVar4," exists in this thread ");
    LogStream::operator<<(psVar5,this->m_threadId);
    Logger::~Logger(&local_1fd0);
  }
  pCVar6 = std::unique_ptr<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>::
           operator->(&this->m_wakeupChannel);
  local_2028 = handleRead;
  local_2020 = 0;
  local_2030 = this;
  std::bind<void(sznet::net::EventLoop::*)(),sznet::net::EventLoop*>
            (&local_2018,(offset_in_EventLoop_to_subr *)&local_2028,&local_2030);
  std::function<void(sznet::Timestamp)>::
  function<std::_Bind<void(sznet::net::EventLoop::*(sznet::net::EventLoop*))()>,void>
            ((function<void(sznet::Timestamp)> *)&local_2000,&local_2018);
  Channel::setReadCallback(pCVar6,&local_2000);
  std::function<void_(sznet::Timestamp)>::~function(&local_2000);
  pCVar6 = std::unique_ptr<sznet::net::Channel,_std::default_delete<sznet::net::Channel>_>::
           operator->(&this->m_wakeupChannel);
  Channel::enableReading(pCVar6);
  return;
}

Assistant:

EventLoop::EventLoop():
	m_looping(false),
	m_quit(false),
	m_eventHandling(false),
	m_callingPendingFunctors(false),
	m_iteration(0),
	m_threadId(CurrentThread::tid()),
	m_poller(Poller::newDefaultPoller(this)),
	m_timerQueue(new TimerQueue(this)),
	m_wakeupFd(sockets::sz_create_eventfd()),
#if defined(SZ_OS_WINDOWS)
	m_wakeupChannel(new Channel(this, m_wakeupFd.event_read)),
#else
	m_wakeupChannel(new Channel(this, m_wakeupFd)),
#endif
	m_currentActiveChannel(nullptr)
{
	LOG_DEBUG << "EventLoop created " << this << " in thread " << m_threadId;
	if (t_loopInThisThread)
	{
		LOG_FATAL << "Another EventLoop " << t_loopInThisThread
			<< " exists in this thread " << m_threadId;
	}
	else
	{
		t_loopInThisThread = this;
	}
	m_wakeupChannel->setReadCallback(std::bind(&EventLoop::handleRead, this));
	m_wakeupChannel->enableReading();
}